

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::PipelineResourceSignatureGLImpl::InitSRBResourceCache
          (PipelineResourceSignatureGLImpl *this,ShaderResourceCacheGL *ResourceCache)

{
  SamplerGLImpl *pSampler;
  Uint32 UVar1;
  IMemoryAllocator *MemAllocator;
  PipelineResourceDesc *pPVar2;
  PipelineResourceAttribsType *Res;
  uint ResIndex;
  Uint32 ArrInd;
  uint uVar3;
  string msg;
  string local_50;
  
  MemAllocator = SRBMemoryAllocator::GetResourceCacheDataAllocator
                           (&(this->
                             super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
                             m_SRBMemAllocator,0);
  ShaderResourceCacheGL::Initialize
            (ResourceCache,
             (TResourceCount *)
             &(this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).field_0xd2,
             MemAllocator,this->m_DynamicUBOMask,this->m_DynamicSSBOMask);
  for (ResIndex = 0;
      ResIndex <
      (this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
      .m_Desc.NumResources; ResIndex = ResIndex + 1) {
    pPVar2 = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceDesc
                       (&this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                        ResIndex);
    Res = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::GetResourceAttribs
                    (&this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                     ResIndex);
    if (pPVar2->ResourceType == SHADER_RESOURCE_TYPE_TEXTURE_SRV) {
      UVar1 = GetImmutableSamplerIdx(this,Res);
      if (UVar1 != 0xffffffff) {
        pSampler = (this->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
                   m_pImmutableSamplers[UVar1].m_pObject;
        if (pSampler == (SamplerGLImpl *)0x0) {
          FormatString<char[53]>
                    (&local_50,(char (*) [53])"Immutable sampler is not initialized - this is a bug"
                    );
          DebugAssertionFailed
                    (local_50._M_dataplus._M_p,"InitSRBResourceCache",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineResourceSignatureGLImpl.cpp"
                     ,0x210);
          std::__cxx11::string::~string((string *)&local_50);
        }
        for (uVar3 = 0; uVar3 < pPVar2->ArraySize; uVar3 = uVar3 + 1) {
          ShaderResourceCacheGL::SetSampler
                    (ResourceCache,Res->CacheOffset + uVar3,(ISampler *)pSampler);
        }
      }
    }
  }
  return;
}

Assistant:

void PipelineResourceSignatureGLImpl::InitSRBResourceCache(ShaderResourceCacheGL& ResourceCache)
{
    ResourceCache.Initialize(m_BindingCount, m_SRBMemAllocator.GetResourceCacheDataAllocator(0), m_DynamicUBOMask, m_DynamicSSBOMask);

    // Initialize immutable samplers
    for (Uint32 r = 0; r < m_Desc.NumResources; ++r)
    {
        const auto& ResDesc = GetResourceDesc(r);
        const auto& ResAttr = GetResourceAttribs(r);

        if (ResDesc.ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_SRV)
            continue;

        const auto ImtblSamplerIdx = GetImmutableSamplerIdx(ResAttr);
        if (ImtblSamplerIdx != InvalidImmutableSamplerIndex)
        {
            ISampler* pSampler = m_pImmutableSamplers[ImtblSamplerIdx];
            VERIFY(pSampler != nullptr, "Immutable sampler is not initialized - this is a bug");

            for (Uint32 ArrInd = 0; ArrInd < ResDesc.ArraySize; ++ArrInd)
                ResourceCache.SetSampler(ResAttr.CacheOffset + ArrInd, pSampler);
        }
    }
}